

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read.c
# Opt level: O1

int main(int argc,char **args)

{
  char *file_name;
  light_pcapng pcapng;
  char *__ptr;
  ulong uVar1;
  
  if (1 < argc) {
    uVar1 = 1;
    do {
      file_name = args[uVar1];
      pcapng = light_read_from_path(file_name);
      if (pcapng == (light_pcapng)0x0) {
        fprintf(_stderr,"Unable to read pcapng: %s\n",file_name);
      }
      else {
        __ptr = light_pcapng_to_string(pcapng);
        printf("Data for %s\n%s\n",file_name,__ptr);
        light_pcapng_release(pcapng);
        free(__ptr);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)argc != uVar1);
  }
  return 0;
}

Assistant:

int main(int argc, const char **args) {
	int i;

	for (i = 1; i < argc; ++i) {
		const char *file = args[i];
		light_pcapng pcapng = light_read_from_path(file);
		if (pcapng != NULL) {
			char *data = light_pcapng_to_string(pcapng);
			printf("Data for %s\n%s\n", file, data);
			light_pcapng_release(pcapng);
			free(data);
		}
		else {
			fprintf(stderr, "Unable to read pcapng: %s\n", file);
		}
	}

	return 0;
}